

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_parallel_game_of_life.cpp
# Opt level: O2

void __thiscall App::ResizeTables(App *this,int w,int h)

{
  Table2D<char> *this_00;
  anon_class_16_2_7fa271ba local_13d0;
  param_type local_13c0;
  mt19937 mt;
  
  if ((h | w) < 0) {
    w = 0;
    h = 0;
  }
  this->idx = 0;
  mt._M_x[0]._0_1_ = 0;
  Table2D<char>::resize((this->table)._M_elems,w,h,(char *)&mt);
  this_00 = (this->table)._M_elems + 1;
  mt._M_x[0]._0_1_ = 0;
  Table2D<char>::resize(this_00,w,h,(char *)&mt);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&mt,0x2a);
  local_13d0.d = (uniform_real_distribution<float> *)&local_13c0;
  local_13c0._M_a = 0.0;
  local_13c0._M_b = 1.0;
  local_13d0.mt = &mt;
  Table2D<char>::fill1<App::ResizeTables(int,int)::_lambda(int)_1_>
            ((this->table)._M_elems,&local_13d0);
  Table2D<char>::fill1<App::ResizeTables(int,int)::_lambda(int)_2_>
            (this_00,(anon_class_1_0_00000001 *)&local_13d0);
  return;
}

Assistant:

void ResizeTables(int w, int h)
	{
		if(w < 0 || h < 0){ w = h = 0; }
		idx = 0;
		table[0].resize(w, h);
		table[1].resize(w, h);

		{
			std::mt19937 mt(42);
			std::uniform_real_distribution<float> d(0.0, 1.0f);
			table[0].fill1([&](int)->char{ return d(mt) < 0.5 ? 0 : 1; }); 
			table[1].fill1([ ](int)->char{ return 0; });
		}
	}